

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

string * __thiscall
wasm::PassRegistry::getPassDescription
          (string *__return_storage_ptr__,PassRegistry *this,string *name)

{
  bool bVar1;
  mapped_type *pmVar2;
  _Self local_30;
  _Self local_28;
  string *local_20;
  string *name_local;
  PassRegistry *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (PassRegistry *)__return_storage_ptr__;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
       ::find(&this->passInfos,name);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
       ::end(&this->passInfos);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (!bVar1) {
    __assert_fail("passInfos.find(name) != passInfos.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x4d,"std::string wasm::PassRegistry::getPassDescription(std::string)");
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
           ::operator[](&this->passInfos,name);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string PassRegistry::getPassDescription(std::string name) {
  assert(passInfos.find(name) != passInfos.end());
  return passInfos[name].description;
}